

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wstring(OutputFile *this,string *s)

{
  ostream *poVar1;
  string *s_local;
  OutputFile *this_local;
  
  poVar1 = stream(this);
  std::operator<<(poVar1,(string *)s);
  return this;
}

Assistant:

OutputFile & OutputFile::wstring (const std::string & s)
{
	stream () << s;
	return *this;
}